

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O1

void __thiscall gpu::shared_device_buffer::resize(shared_device_buffer *this,size_t size)

{
  Type TVar1;
  cl_mem p_Var2;
  long *plVar3;
  Context context;
  undefined1 local_90 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  string local_68;
  string local_48;
  
  if (this->size_ != size) {
    decref(this);
    Context::Context((Context *)(local_90 + 0x10));
    TVar1 = Context::type((Context *)(local_90 + 0x10));
    if (TVar1 == TypeOpenCL) {
      Context::cl((Context *)local_90);
      p_Var2 = ocl::OpenCLEngine::createBuffer((OpenCLEngine *)local_90._0_8_,1,size);
      this->data_ = p_Var2;
      if ((element_type *)local_90._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
      }
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_device_buffer.cpp"
                 ,"");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"No GPU context!","");
      raiseException(&local_48,0xb9,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    plVar3 = (long *)operator_new__(8);
    this->buffer_ = (uchar *)plVar3;
    *plVar3 = 0;
    LOCK();
    *plVar3 = *plVar3 + 1;
    UNLOCK();
    this->type_ = TVar1;
    this->size_ = size;
    this->offset_ = 0;
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    }
  }
  return;
}

Assistant:

void shared_device_buffer::resize(size_t size)
{
	if (size == size_)
		return;

	decref();

	Context context;
	Context::Type type = context.type();

	switch (type) {
#ifdef CUDA_SUPPORT
	case Context::TypeCUDA:
		CUDA_SAFE_CALL( cudaMalloc(&data_, size) );
		break;
#endif
	case Context::TypeOpenCL:
		data_ = context.cl()->createBuffer(CL_MEM_READ_WRITE, size);
		break;
	default:
		gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}

	buffer_	= new unsigned char [8];
	* (long long *) buffer_ = 0;
	incref();

	type_	= type;
	size_	= size;
	offset_	= 0;
}